

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> __thiscall
capnp::_::BuilderArena::getSegmentsForOutput(BuilderArena *this)

{
  MultiSegmentState *pMVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  RemoveConst<kj::ArrayPtr<const_capnp::word>_> *pRVar3;
  word *pwVar4;
  word *pwVar5;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar6;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *builder;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar7;
  uint uVar8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar9;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar10;
  
  pMVar1 = (this->moreSegments).ptr.ptr;
  if (pMVar1 != (MultiSegmentState *)0x0) {
    pAVar2 = (pMVar1->forOutput).builder.ptr;
    pRVar3 = (pMVar1->forOutput).builder.pos;
    pwVar4 = (this->segment0).super_SegmentReader.ptr.ptr;
    pwVar5 = (this->segment0).pos;
    pAVar2->ptr = pwVar4;
    pAVar2->size_ = (long)pwVar5 - (long)pwVar4 >> 3;
    pMVar1 = (this->moreSegments).ptr.ptr;
    pOVar6 = (pMVar1->builders).builder.pos;
    uVar8 = 1;
    for (pOVar7 = (pMVar1->builders).builder.ptr; pOVar7 != pOVar6; pOVar7 = pOVar7 + 1) {
      pwVar4 = (pOVar7->ptr->super_SegmentReader).ptr.ptr;
      pwVar5 = pOVar7->ptr->pos;
      pAVar2[uVar8].ptr = pwVar4;
      pAVar2[uVar8].size_ = (long)pwVar5 - (long)pwVar4 >> 3;
      uVar8 = uVar8 + 1;
    }
    AVar9.size_ = (long)pRVar3 - (long)pAVar2 >> 4;
    AVar9.ptr = pAVar2;
    return AVar9;
  }
  if ((this->segment0).super_SegmentReader.arena != (Arena *)0x0) {
    pwVar4 = (this->segment0).super_SegmentReader.ptr.ptr;
    pwVar5 = (this->segment0).pos;
    (this->segment0ForOutput).ptr = pwVar4;
    (this->segment0ForOutput).size_ = (long)pwVar5 - (long)pwVar4 >> 3;
    AVar10.size_ = 1;
    AVar10.ptr = &this->segment0ForOutput;
    return AVar10;
  }
  return (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>)ZEXT816(0);
}

Assistant:

inline operator T*() { return ptr; }